

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O2

size_t ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *ws,ZSTD_cwksp_alloc_phase_e phase)

{
  ZSTD_cwksp_alloc_phase_e ZVar1;
  void *pvVar2;
  
  ZVar1 = ws->phase;
  if (phase <= ZVar1) {
    return 0;
  }
  if (ZVar1 == ZSTD_cwksp_alloc_objects) {
    ws->tableValidEnd = ws->objectEnd;
  }
  if (ZSTD_cwksp_alloc_buffers < phase && ZVar1 < ZSTD_cwksp_alloc_aligned) {
    pvVar2 = ZSTD_cwksp_reserve_internal_buffer_space
                       (ws,0x40 - (ulong)(-*(int *)&ws->allocStart & 0x3f));
    if (pvVar2 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    pvVar2 = (void *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd);
    if (ws->workspaceEnd < pvVar2) {
      return 0xffffffffffffffc0;
    }
    ws->objectEnd = pvVar2;
    ws->tableEnd = pvVar2;
    ws->tableValidEnd = pvVar2;
  }
  ws->phase = phase;
  return 0;
}

Assistant:

MEM_STATIC size_t ZSTD_cwksp_internal_advance_phase(
        ZSTD_cwksp* ws, ZSTD_cwksp_alloc_phase_e phase) {
    assert(phase >= ws->phase);
    if (phase > ws->phase) {
        /* Going from allocating objects to allocating buffers */
        if (ws->phase < ZSTD_cwksp_alloc_buffers &&
                phase >= ZSTD_cwksp_alloc_buffers) {
            ws->tableValidEnd = ws->objectEnd;
        }

        /* Going from allocating buffers to allocating aligneds/tables */
        if (ws->phase < ZSTD_cwksp_alloc_aligned &&
                phase >= ZSTD_cwksp_alloc_aligned) {
            {   /* Align the start of the "aligned" to 64 bytes. Use [1, 64] bytes. */
                size_t const bytesToAlign =
                    ZSTD_CWKSP_ALIGNMENT_BYTES - ZSTD_cwksp_bytes_to_align_ptr(ws->allocStart, ZSTD_CWKSP_ALIGNMENT_BYTES);
                DEBUGLOG(5, "reserving aligned alignment addtl space: %zu", bytesToAlign);
                ZSTD_STATIC_ASSERT((ZSTD_CWKSP_ALIGNMENT_BYTES & (ZSTD_CWKSP_ALIGNMENT_BYTES - 1)) == 0); /* power of 2 */
                RETURN_ERROR_IF(!ZSTD_cwksp_reserve_internal_buffer_space(ws, bytesToAlign),
                                memory_allocation, "aligned phase - alignment initial allocation failed!");
            }
            {   /* Align the start of the tables to 64 bytes. Use [0, 63] bytes */
                void* const alloc = ws->objectEnd;
                size_t const bytesToAlign = ZSTD_cwksp_bytes_to_align_ptr(alloc, ZSTD_CWKSP_ALIGNMENT_BYTES);
                void* const end = (BYTE*)alloc + bytesToAlign;
                DEBUGLOG(5, "reserving table alignment addtl space: %zu", bytesToAlign);
                RETURN_ERROR_IF(end > ws->workspaceEnd, memory_allocation,
                                "table phase - alignment initial allocation failed!");
                ws->objectEnd = end;
                ws->tableEnd = end;
                ws->tableValidEnd = end;
            }
        }
        ws->phase = phase;
        ZSTD_cwksp_assert_internal_consistency(ws);
    }
    return 0;
}